

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O1

void proj_display(menu_conflict *m,wchar_t type,_Bool cursor,wchar_t row,wchar_t col,wchar_t wid)

{
  uint8_t uVar1;
  wchar_t wVar2;
  char *str;
  wchar_t *pwVar3;
  undefined7 in_register_00000011;
  wchar_t col_00;
  wchar_t *pwVar4;
  long lVar5;
  
  uVar1 = curs_attrs[1][CONCAT71(in_register_00000011,cursor) & 0xffffffff];
  str = proj_idx_to_name(type);
  if ((type & 1U) != 0) {
    c_prt(uVar1,".........................",row,col);
  }
  c_put_str(uVar1,str,row,col);
  col_00 = col + L'\x19';
  if (tile_height == '\x01') {
    pwVar4 = L"*|/-\\";
    lVar5 = 0;
    do {
      if (use_graphics == L'\0') {
        uVar1 = (uint8_t)projections[type].color;
        pwVar3 = pwVar4;
      }
      else {
        uVar1 = proj_to_attr[type][lVar5];
        pwVar3 = proj_to_char[type] + lVar5;
      }
      wVar2 = big_pad(col_00,row,uVar1,*pwVar3);
      col_00 = col_00 + wVar2;
      lVar5 = lVar5 + 1;
      pwVar4 = pwVar4 + 1;
    } while (lVar5 != 5);
    return;
  }
  prt("Change tile_height to 1 to see graphics.",row,col_00);
  return;
}

Assistant:

static void proj_display(struct menu *m, int type, bool cursor,
		int row, int col, int wid)
{
	size_t i;

	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];
	const char *proj_name = proj_idx_to_name(type);

	if (type % 2) c_prt(attr, ".........................", row, col);
	c_put_str(attr, proj_name, row, col);

	col += 25;

	if (tile_height == 1) {
		for (i = 0; i < BOLT_MAX; i++) {
			if (use_graphics == GRAPHICS_NONE) {
				/* ASCII is simple */
				wchar_t chars[] = L"*|/-\\";

				col += big_pad(col, row,
					projections[type].color, chars[i]);
			} else {
				col += big_pad(col, row, proj_to_attr[type][i],
					proj_to_char[type][i]);
			}
		}
	} else {
		prt("Change tile_height to 1 to see graphics.", row, col);
	}
}